

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cjpeg.c
# Opt level: O0

cjpeg_source_ptr select_file_type(j_compress_ptr cinfo,FILE *infile)

{
  int __c;
  int iVar1;
  FILE *in_RSI;
  long *in_RDI;
  int c;
  boolean in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined8 local_8;
  
  if (is_targa == 0) {
    __c = getc(in_RSI);
    if (__c == -1) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x2a;
      (**(code **)*in_RDI)(in_RDI);
    }
    iVar1 = ungetc(__c,in_RSI);
    if (iVar1 == -1) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x414;
      (**(code **)*in_RDI)(in_RDI);
    }
    if (__c == 0) {
      local_8 = jinit_read_targa((j_compress_ptr)0x0);
    }
    else if (__c == 0x42) {
      local_8 = jinit_read_bmp((j_compress_ptr)0x4200000042,in_stack_ffffffffffffffdc);
    }
    else if (__c == 0x47) {
      local_8 = jinit_read_gif((j_compress_ptr)0x4700000047);
    }
    else if (__c == 0x50) {
      local_8 = jinit_read_ppm((j_compress_ptr)0x5000000050);
    }
    else {
      *(undefined4 *)(*in_RDI + 0x28) = 0x415;
      (**(code **)*in_RDI)(in_RDI);
      local_8 = (cjpeg_source_ptr)0x0;
    }
  }
  else {
    local_8 = jinit_read_targa((j_compress_ptr)
                               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  }
  return local_8;
}

Assistant:

LOCAL(cjpeg_source_ptr)
select_file_type(j_compress_ptr cinfo, FILE *infile)
{
  int c;

  if (is_targa) {
#ifdef TARGA_SUPPORTED
    return jinit_read_targa(cinfo);
#else
    ERREXIT(cinfo, JERR_TGA_NOTCOMP);
#endif
  }

  if ((c = getc(infile)) == EOF)
    ERREXIT(cinfo, JERR_INPUT_EMPTY);
  if (ungetc(c, infile) == EOF)
    ERREXIT(cinfo, JERR_UNGETC_FAILED);

  switch (c) {
#ifdef BMP_SUPPORTED
  case 'B':
    return jinit_read_bmp(cinfo, TRUE);
#endif
#ifdef GIF_SUPPORTED
  case 'G':
    return jinit_read_gif(cinfo);
#endif
#ifdef PPM_SUPPORTED
  case 'P':
    return jinit_read_ppm(cinfo);
#endif
#ifdef TARGA_SUPPORTED
  case 0x00:
    return jinit_read_targa(cinfo);
#endif
  default:
    ERREXIT(cinfo, JERR_UNKNOWN_FORMAT);
    break;
  }

  return NULL;                  /* suppress compiler warnings */
}